

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto_storage.c
# Opt level: O0

psa_status_t
psa_parse_key_data_from_storage
          (uint8_t *storage_data,size_t storage_data_length,uint8_t **key_data,
          size_t *key_data_length,psa_core_key_attributes_t *attr)

{
  uint8_t *puVar1;
  uint32_t type;
  uint32_t version;
  psa_persistent_key_storage_format *storage_format;
  psa_status_t status;
  psa_core_key_attributes_t *attr_local;
  size_t *key_data_length_local;
  uint8_t **key_data_local;
  size_t storage_data_length_local;
  uint8_t *storage_data_local;
  
  if (storage_data_length < 0x24) {
    storage_data_local._4_4_ = -0x92;
  }
  else {
    storage_data_local._4_4_ = check_magic_header(storage_data);
    if (storage_data_local._4_4_ == 0) {
      if (*(int *)(storage_data + 8) == 0) {
        *key_data_length = (ulong)*(uint *)(storage_data + 0x20);
        if ((storage_data_length - 0x24 < *key_data_length) || (0x1fff < *key_data_length)) {
          storage_data_local._4_4_ = -0x92;
        }
        else {
          if (*key_data_length == 0) {
            *key_data = (uint8_t *)0x0;
          }
          else {
            puVar1 = (uint8_t *)calloc(1,*key_data_length);
            *key_data = puVar1;
            if (*key_data == (uint8_t *)0x0) {
              return -0x8d;
            }
            memcpy(*key_data,storage_data + 0x24,*key_data_length);
          }
          attr->lifetime = *(psa_key_lifetime_t *)(storage_data + 0xc);
          if (*(uint *)(storage_data + 0x10) < 0x10000) {
            attr->type = (psa_key_type_t)*(uint *)(storage_data + 0x10);
            (attr->policy).usage = *(psa_key_usage_t *)(storage_data + 0x14);
            (attr->policy).alg = *(psa_algorithm_t *)(storage_data + 0x18);
            (attr->policy).alg2 = *(psa_algorithm_t *)(storage_data + 0x1c);
            storage_data_local._4_4_ = 0;
          }
          else {
            storage_data_local._4_4_ = -0x92;
          }
        }
      }
      else {
        storage_data_local._4_4_ = -0x92;
      }
    }
  }
  return storage_data_local._4_4_;
}

Assistant:

psa_status_t psa_parse_key_data_from_storage( const uint8_t *storage_data,
                                              size_t storage_data_length,
                                              uint8_t **key_data,
                                              size_t *key_data_length,
                                              psa_core_key_attributes_t *attr )
{
    psa_status_t status;
    const psa_persistent_key_storage_format *storage_format =
        (const psa_persistent_key_storage_format *)storage_data;
    uint32_t version;
    uint32_t type;

    if( storage_data_length < sizeof(*storage_format) )
        return( PSA_ERROR_STORAGE_FAILURE );

    status = check_magic_header( storage_data );
    if( status != PSA_SUCCESS )
        return( status );

    GET_UINT32_LE( version, storage_format->version, 0 );
    if( version != 0 )
        return( PSA_ERROR_STORAGE_FAILURE );

    GET_UINT32_LE( *key_data_length, storage_format->data_len, 0 );
    if( *key_data_length > ( storage_data_length - sizeof(*storage_format) ) ||
        *key_data_length > PSA_CRYPTO_MAX_STORAGE_SIZE )
        return( PSA_ERROR_STORAGE_FAILURE );

    if( *key_data_length == 0 )
    {
        *key_data = NULL;
    }
    else
    {
        *key_data = mbedtls_calloc( 1, *key_data_length );
        if( *key_data == NULL )
            return( PSA_ERROR_INSUFFICIENT_MEMORY );
        memcpy( *key_data, storage_format->key_data, *key_data_length );
    }

    GET_UINT32_LE( attr->lifetime, storage_format->lifetime, 0 );
    GET_UINT32_LE( type, storage_format->type, 0 );
    if( type <= (psa_key_type_t) -1 )
        attr->type = (psa_key_type_t) type;
    else
        return( PSA_ERROR_STORAGE_FAILURE );
    GET_UINT32_LE( attr->policy.usage, storage_format->policy, 0 );
    GET_UINT32_LE( attr->policy.alg, storage_format->policy, sizeof( uint32_t ) );
    GET_UINT32_LE( attr->policy.alg2, storage_format->policy, 2 * sizeof( uint32_t ) );

    return( PSA_SUCCESS );
}